

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

QuantizationParams * __thiscall
CoreML::Specification::WeightParams::mutable_quantization(WeightParams *this)

{
  QuantizationParams *this_00;
  WeightParams *this_local;
  
  if (this->quantization_ == (QuantizationParams *)0x0) {
    this_00 = (QuantizationParams *)operator_new(0x28);
    QuantizationParams::QuantizationParams(this_00);
    this->quantization_ = this_00;
  }
  return this->quantization_;
}

Assistant:

inline ::CoreML::Specification::QuantizationParams* WeightParams::mutable_quantization() {
  
  if (quantization_ == NULL) {
    quantization_ = new ::CoreML::Specification::QuantizationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.WeightParams.quantization)
  return quantization_;
}